

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O2

int unit_cmp_exact(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = 0;
  if ((((UnitsOn == '\x01') && (iVar4 = 1, unitonflag != 0)) && (usp[-1].dim[0] != '\t')) &&
     (usp->dim[0] != '\t')) {
    lVar3 = -0x10;
    do {
      if (lVar3 == -6) {
        if (ABS(usp->factor / usp[-1].factor + -1.0) <= 1e-05) {
          return 1;
        }
        break;
      }
      lVar1 = lVar3 + -8;
      lVar2 = lVar3 + -8;
      lVar3 = lVar3 + 1;
    } while (usp->dim[lVar1] == usp[1].dim[lVar2]);
    iVar4 = 0;
    if (fperrc != 0) {
      diag("underflow or overflow in units calculation",(char *)0x0);
    }
  }
  return iVar4;
}

Assistant:

int
unit_cmp_exact() { /* returns 1 if top two units on stack are same */
	struct unit *up;
	int i;

	{if (!UnitsOn) return 0;}
	up = usp - 1;
   if (unitonflag) {
	if (up->dim[0] == 9 || usp->dim[0] == 9) {
		return 1;
	}
	for (i=0; i<NDIM; i++) {
		if (up->dim[i] != usp->dim[i]) {
			chkfperror();
			return 0;
		}
	}
	if (OUTTOLERANCE(up->factor, usp->factor)) {
		chkfperror();
		return 0;
	}
   }
	return 1;
}